

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O1

int SUNLinSolFree(SUNLinearSolver S)

{
  _func_int_SUNLinearSolver *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  if (S != (SUNLinearSolver)0x0) {
    if ((S->ops != (SUNLinearSolver_Ops)0x0) &&
       (UNRECOVERED_JUMPTABLE = S->ops->free,
       UNRECOVERED_JUMPTABLE != (_func_int_SUNLinearSolver *)0x0)) {
      iVar1 = (*UNRECOVERED_JUMPTABLE)(S);
      return iVar1;
    }
    if (S->content != (void *)0x0) {
      free(S->content);
      S->content = (void *)0x0;
    }
    if (S->ops != (SUNLinearSolver_Ops)0x0) {
      free(S->ops);
      S->ops = (SUNLinearSolver_Ops)0x0;
    }
    free(S);
  }
  return 0;
}

Assistant:

int SUNLinSolFree(SUNLinearSolver S)
{
  if (S == NULL) return SUNLS_SUCCESS;

  /* if the free operation exists use it */
  if (S->ops)
    if (S->ops->free) return(S->ops->free(S));

  /* if we reach this point, either ops == NULL or free == NULL,
     try to cleanup by freeing the content, ops, and solver */
  if (S->content) { free(S->content); S->content = NULL; }
  if (S->ops) { free(S->ops); S->ops = NULL; }
  free(S); S = NULL;

  return(SUNLS_SUCCESS);
}